

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_VRR_Algorithm_Base.cpp
# Opt level: O0

void __thiscall
OSTEI_VRR_Algorithm_Base::Create_WithOrder(OSTEI_VRR_Algorithm_Base *this,QAM *q,IdxOrder idx_order)

{
  QAM *in_RDI;
  QAM *in_stack_000001b8;
  QuartetSet *in_stack_000015b8;
  OSTEI_VRR_Algorithm_Base *in_stack_000015c0;
  IdxOrder in_stack_000015c8;
  QAM local_80 [2];
  
  QAM::QAM(local_80,in_RDI);
  GenerateQuartetTargets(in_stack_000001b8);
  Create_WithOrder(in_stack_000015c0,in_stack_000015b8,in_stack_000015c8);
  std::set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_>::~set
            ((set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_> *)0x123024);
  QAM::~QAM((QAM *)0x12302e);
  return;
}

Assistant:

void OSTEI_VRR_Algorithm_Base::Create_WithOrder(QAM q, IdxOrder idx_order)
{
    Create_WithOrder(GenerateQuartetTargets(q), idx_order);
}